

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
Tokenizer::registerReplacementString(Tokenizer *this,Identifier *identifier,StringLiteral *newValue)

{
  string *psVar1;
  undefined1 local_108 [8];
  Replacement replacement;
  StringLiteral local_a0;
  undefined1 local_80 [8];
  Token tok;
  StringLiteral *newValue_local;
  Identifier *identifier_local;
  Tokenizer *this_local;
  
  tok.originalText.field_2._8_8_ = newValue;
  Token::Token((Token *)local_80);
  tok.column._0_4_ = 3;
  StringLiteral::StringLiteral(&local_a0,(StringLiteral *)tok.originalText.field_2._8_8_);
  psVar1 = StringLiteral::string_abi_cxx11_((StringLiteral *)tok.originalText.field_2._8_8_);
  std::__cxx11::string::string
            ((string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)psVar1);
  Token::setValue<StringLiteral>
            ((Token *)local_80,&local_a0,
             (string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  StringLiteral::~StringLiteral(&local_a0);
  Replacement::Replacement((Replacement *)local_108);
  Identifier::operator=((Identifier *)local_108,identifier);
  std::vector<Token,_std::allocator<Token>_>::push_back
            ((vector<Token,_std::allocator<Token>_> *)
             ((long)&replacement.identifier._name.field_2 + 8),(value_type *)local_80);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,(value_type *)local_108);
  Replacement::~Replacement((Replacement *)local_108);
  Token::~Token((Token *)local_80);
  return;
}

Assistant:

void Tokenizer::registerReplacementString(const Identifier& identifier, const StringLiteral& newValue)
{
	Token tok;
	tok.type = TokenType::String;
	tok.setValue(newValue, newValue.string());

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}